

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DeleteFromSEL(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *SelNext;
  TEdge *SelPrev;
  TEdge *e_local;
  Clipper *this_local;
  
  pTVar1 = e->prevInSEL;
  pTVar2 = e->nextInSEL;
  if (((pTVar1 != (TEdge *)0x0) || (pTVar2 != (TEdge *)0x0)) || (e == this->m_SortedEdges)) {
    if (pTVar1 == (TEdge *)0x0) {
      this->m_SortedEdges = pTVar2;
    }
    else {
      pTVar1->nextInSEL = pTVar2;
    }
    if (pTVar2 != (TEdge *)0x0) {
      pTVar2->prevInSEL = pTVar1;
    }
    e->nextInSEL = (TEdge *)0x0;
    e->prevInSEL = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::DeleteFromSEL(TEdge *e)
{
  TEdge* SelPrev = e->prevInSEL;
  TEdge* SelNext = e->nextInSEL;
  if( !SelPrev &&  !SelNext && (e != m_SortedEdges) ) return; //already deleted
  if( SelPrev ) SelPrev->nextInSEL = SelNext;
  else m_SortedEdges = SelNext;
  if( SelNext ) SelNext->prevInSEL = SelPrev;
  e->nextInSEL = 0;
  e->prevInSEL = 0;
}